

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::cancelGesturesForChildren(QGraphicsScenePrivate *this,QGesture *original)

{
  QHash<QGesture_*,_QGraphicsObject_*> *this_00;
  QGesture **ppQVar1;
  long lVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QGesture *gesture;
  long *plVar5;
  QGraphicsItemPrivate *pQVar6;
  QGestureManager *this_01;
  int *piVar7;
  bool bVar8;
  bool bVar9;
  GestureType GVar10;
  Node<QGesture_*,_QGraphicsObject_*> *pNVar11;
  QGraphicsObject **ppQVar12;
  Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *pDVar13;
  QGraphicsObject *pQVar14;
  QGraphicsObject *pQVar15;
  ulong uVar16;
  long lVar17;
  Data *pDVar18;
  QGesture **ppQVar19;
  long lVar20;
  QHash<QGesture_*,_QHashDummyValue> QVar21;
  QGraphicsItem *pQVar22;
  undefined8 *puVar23;
  undefined8 *puVar24;
  uint uVar25;
  int iVar26;
  size_t sVar27;
  ulong uVar28;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar29;
  long in_FS_OFFSET;
  byte bVar30;
  piter it;
  QGestureEvent ev;
  QSet<QGesture_*> almostCanceledGestures;
  QGestureEvent ev_1;
  QArrayData *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 *local_118;
  undefined1 local_108 [12];
  char cStack_fc;
  Data *local_f8;
  QGesture **ppQStack_f0;
  undefined1 *local_e8;
  QWidget *pQStack_e0;
  QMap<Qt::GestureType,_bool> local_d8;
  QMap<Qt::GestureType,_QWidget_*> QStack_d0;
  QList<QGesture_*> local_c8;
  QHash<QGesture_*,_QHashDummyValue> local_a8;
  QHash<QGesture_*,_QHashDummyValue> local_a0;
  QHash<QGesture_*,_QHashDummyValue> local_98;
  QGesture *local_90;
  undefined1 local_88 [12];
  char cStack_7c;
  Data *local_78;
  QGesture **ppQStack_70;
  undefined1 *local_68;
  QWidget *pQStack_60;
  QMap<Qt::GestureType,_bool> local_58;
  QMap<Qt::GestureType,_QWidget_*> QStack_50;
  ushort local_40;
  long local_38;
  
  bVar30 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar18 = (this->gestureTargets).d;
  local_90 = original;
  if ((pDVar18 == (Data *)0x0) ||
     (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)pDVar18,
                                    &local_90),
     pNVar11 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
    ppQVar12 = (QGraphicsObject **)0x0;
  }
  else {
    ppQVar12 = &pNVar11->value;
  }
  if (ppQVar12 == (QGraphicsObject **)0x0) {
    pQVar15 = (QGraphicsObject *)0x0;
  }
  else {
    pQVar15 = *ppQVar12;
  }
  if (pQVar15 == (QGraphicsObject *)0x0) goto LAB_0061d313;
  this_00 = &this->gestureTargets;
  local_98.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
  pDVar13 = this_00->d;
  if (pDVar13 == (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0) {
    pDVar18 = (Data *)0x0;
LAB_0061cb85:
    uVar28 = 0;
  }
  else {
    if (1 < (uint)(pDVar13->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar13 = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::detached
                          (pDVar13);
      this_00->d = pDVar13;
    }
    pDVar18 = this_00->d;
    if (pDVar18->spans->offsets[0] != 0xff) goto LAB_0061cb85;
    uVar16 = 1;
    do {
      uVar28 = uVar16;
      if (pDVar18->numBuckets == uVar28) {
        pDVar18 = (Data *)0x0;
        uVar28 = 0;
        break;
      }
      uVar16 = uVar28 + 1;
    } while (pDVar18->spans[uVar28 >> 7].offsets[(uint)uVar28 & 0x7f] == 0xff);
  }
  if (uVar28 != 0 || pDVar18 != (Data *)0x0) {
    do {
      uVar16 = uVar28 >> 7;
      uVar25 = (uint)uVar28 & 0x7f;
      lVar2 = *(long *)(pDVar18->spans[uVar16].entries[pDVar18->spans[uVar16].offsets[uVar25]].
                        storage.data + 8);
      pQVar22 = (QGraphicsItem *)(lVar2 + 0x10);
      if (lVar2 == 0) {
        pQVar22 = (QGraphicsItem *)0x0;
      }
      if ((pQVar22 != &pQVar15->super_QGraphicsItem) &&
         (bVar8 = QGraphicsItem::isAncestorOf(&pQVar15->super_QGraphicsItem,pQVar22), bVar8)) {
        pSVar3 = pDVar18->spans;
        pEVar4 = pSVar3[uVar16].entries;
        *(undefined4 *)
         (*(long *)(*(long *)pEVar4[pSVar3[uVar16].offsets[uVar25]].storage.data + 8) + 0x7c) = 4;
        local_88._0_8_ = *(undefined8 *)pEVar4[pSVar3[uVar16].offsets[uVar25]].storage.data;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)&local_98,(QGesture **)local_88,
                   (QHashDummyValue *)local_108);
      }
      do {
        if (pDVar18->numBuckets - 1 == uVar28) {
          uVar28 = 0;
          pDVar18 = (Data *)0x0;
          break;
        }
        uVar28 = uVar28 + 1;
      } while (pDVar18->spans[uVar28 >> 7].offsets[(uint)uVar28 & 0x7f] == 0xff);
    } while ((uVar28 != 0) || (pDVar18 != (Data *)0x0));
  }
  local_a0.d = local_98.d;
  if ((local_98.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) &&
     (((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  while ((local_a0.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
         ((local_a0.d)->size != 0))) {
    local_a8.d = (Data *)0x0;
    if (local_a0.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
      if (1 < (uint)((local_a0.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
        local_a0.d = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::detached
                               (local_a0.d);
      }
      QVar21.d = local_a0.d;
      if ((local_a0.d)->spans->offsets[0] != 0xff) goto LAB_0061cd02;
      uVar28 = 1;
      do {
        sVar27 = uVar28;
        if ((local_a0.d)->numBuckets == sVar27) goto LAB_0061ccd4;
        uVar28 = sVar27 + 1;
      } while ((local_a0.d)->spans[sVar27 >> 7].offsets[(uint)sVar27 & 0x7f] == 0xff);
    }
    else {
LAB_0061ccd4:
      QVar21.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
LAB_0061cd02:
      sVar27 = 0;
    }
    it.bucket = sVar27;
    it.d = QVar21.d;
    pQVar15 = (QGraphicsObject *)0x0;
    if (QVar21.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 || sVar27 != 0) {
      do {
        uVar16 = it.bucket;
        pDVar29 = it.d;
        uVar28 = uVar16 >> 7;
        uVar25 = (uint)it.bucket & 0x7f;
        if ((this_00->d == (Data *)0x0) ||
           (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                      findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)
                                          this_00->d,
                                          (QGesture **)
                                          (pDVar29->spans[uVar28].entries +
                                          pDVar29->spans[uVar28].offsets[uVar25])),
           pNVar11 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
          ppQVar12 = (QGraphicsObject **)0x0;
        }
        else {
          ppQVar12 = &pNVar11->value;
        }
        if (ppQVar12 == (QGraphicsObject **)0x0) {
          pQVar14 = (QGraphicsObject *)0x0;
        }
        else {
          pQVar14 = *ppQVar12;
        }
        if (pQVar15 == (QGraphicsObject *)0x0) {
          pQVar15 = pQVar14;
        }
        if (pQVar15 == pQVar14) {
          local_88._0_8_ =
               *(undefined8 *)
                pDVar29->spans[uVar28].entries[pDVar29->spans[uVar28].offsets[uVar25]].storage.data;
          QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QGesture*,QHashDummyValue> *)&local_a8,(QGesture **)local_88,
                     (QHashDummyValue *)local_108);
          it = (piter)QHash<QGesture_*,_QHashDummyValue>::erase(&local_a0,(const_iterator)it);
        }
        else {
          do {
            if (pDVar29->numBuckets - 1 == uVar16) {
              it = (piter)ZEXT816(0);
              break;
            }
            uVar16 = uVar16 + 1;
            it.bucket = uVar16;
            it.d = pDVar29;
          } while (pDVar29->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
        }
      } while ((it.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) ||
              (it.bucket != 0));
    }
    local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
    QSet<QGesture_*>::values(&local_c8,(QSet<QGesture_*> *)&local_a8);
    local_d8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    QStack_d0.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_e0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    ppQStack_f0 = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
    local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff00 = &DAT_aaaaaaaaaaaaaaaa;
    QGestureEvent::QGestureEvent((QGestureEvent *)local_108,&local_c8);
    pQVar22 = &pQVar15->super_QGraphicsItem;
    if (pQVar15 == (QGraphicsObject *)0x0) {
      pQVar22 = (QGraphicsItem *)0x0;
    }
    sendEvent(this,pQVar22,(QEvent *)local_108);
    if ((cStack_fc == '\0') && ((undefined1 *)local_c8.d.size != (undefined1 *)0x0)) {
      ppQVar1 = local_c8.d.ptr + local_c8.d.size;
      ppQVar19 = local_c8.d.ptr;
      do {
        gesture = *ppQVar19;
        bVar8 = QGestureEvent::isAccepted((QGestureEvent *)local_108,gesture);
        if ((!bVar8) && (bVar8 = QGesture::hasHotSpot(gesture), bVar8)) {
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          local_128 = 0xaaaaaaaa;
          uStack_124 = 0xaaaaaaaa;
          uStack_120 = 0xaaaaaaaa;
          uStack_11c = 0xaaaaaaaa;
          lVar2 = *(long *)&gesture->field_0x8;
          lVar20 = *(long *)&this->field_0x8;
          puVar23 = &DAT_00702c10;
          puVar24 = (undefined8 *)local_88;
          for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar24 = *puVar23;
            puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
            puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
          }
          local_40 = local_40 & 0xfc00;
          plVar5 = *(long **)(*(long *)(lVar20 + 8) + 0x88);
          (**(code **)(*plVar5 + 0x68))(&local_128,plVar5,lVar2 + 0x90,1,1);
          if (local_118 != (undefined1 *)0x0) {
            lVar2 = CONCAT44(uStack_11c,uStack_120);
            lVar20 = (long)local_118 << 3;
            lVar17 = 0;
            do {
              pQVar15 = QGraphicsItem::toGraphicsObject(*(QGraphicsItem **)(lVar2 + lVar17));
              if (pQVar15 == (QGraphicsObject *)0x0) {
                iVar26 = 0xb;
              }
              else {
                pQVar6 = (pQVar15->super_QGraphicsItem).d_ptr.d;
                GVar10 = QGesture::gestureType(gesture);
                local_88._0_4_ = GVar10;
                bVar8 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                  (&pQVar6->gestureContext,(GestureType *)local_88);
                if (bVar8) {
                  local_148 = (QArrayData *)0x0;
                  uStack_140 = 0;
                  local_138 = 0;
                  bVar8 = false;
                  local_88._0_8_ = gesture;
                  QtPrivate::QPodArrayOps<QGesture*>::emplace<QGesture*&>
                            ((QPodArrayOps<QGesture*> *)&local_148,0,(QGesture **)local_88);
                  QList<QGesture_*>::end((QList<QGesture_*> *)&local_148);
                  local_58.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
                        )&DAT_aaaaaaaaaaaaaaaa;
                  QStack_50.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
                        )&DAT_aaaaaaaaaaaaaaaa;
                  local_68 = &DAT_aaaaaaaaaaaaaaaa;
                  pQStack_60 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
                  local_78 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  ppQStack_70 = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
                  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
                  QGestureEvent::QGestureEvent
                            ((QGestureEvent *)local_88,(QList<QGesture_*> *)&local_148);
                  sendEvent(this,&pQVar15->super_QGraphicsItem,(QEvent *)local_88);
                  if (cStack_7c == '\0') {
                    bVar9 = QGestureEvent::isAccepted((QGestureEvent *)local_88,gesture);
                    bVar8 = !bVar9;
                    iVar26 = 0;
                    if (bVar9) {
                      iVar26 = 10;
                    }
                  }
                  else {
                    iVar26 = 10;
                  }
                  QGestureEvent::~QGestureEvent((QGestureEvent *)local_88);
                  if (local_148 != (QArrayData *)0x0) {
                    LOCK();
                    (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_148,8,0x10);
                    }
                  }
                  if (!bVar8) goto LAB_0061d0e0;
                }
                iVar26 = 0;
              }
LAB_0061d0e0:
            } while (((iVar26 == 0xb) || (iVar26 == 0)) && (lVar17 = lVar17 + 8, lVar20 != lVar17));
          }
          piVar7 = (int *)CONCAT44(uStack_124,local_128);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_124,local_128),8,0x10);
            }
          }
        }
        ppQVar19 = ppQVar19 + 1;
      } while (ppQVar19 != ppQVar1);
    }
    QGestureEvent::~QGestureEvent((QGestureEvent *)local_108);
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,8,0x10);
      }
    }
    QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_a8);
  }
  this_01 = QApplicationPrivate::self->gestureManager;
  if (local_98.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
    QVar21.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
LAB_0061d24b:
    uVar28 = 0;
  }
  else {
    if (1 < (uint)((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_98.d = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::detached
                             (local_98.d);
    }
    QVar21.d = local_98.d;
    if ((local_98.d)->spans->offsets[0] != 0xff) goto LAB_0061d24b;
    uVar16 = 1;
    do {
      uVar28 = uVar16;
      if ((local_98.d)->numBuckets == uVar28) {
        QVar21.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
        uVar28 = 0;
        break;
      }
      uVar16 = uVar28 + 1;
    } while ((local_98.d)->spans[uVar28 >> 7].offsets[(uint)uVar28 & 0x7f] == 0xff);
  }
  if (uVar28 != 0 || QVar21.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
    do {
      lVar2 = (uVar28 >> 3 & 0xfffffffffffffff0) * 9;
      uVar16 = (ulong)((uint)uVar28 & 0x7f);
      QGestureManager::recycle
                ((QGestureManager *)this_01,
                 *(QGesture **)
                  (*(long *)((QVar21.d)->spans->offsets + lVar2 + 0x80) +
                  (ulong)(QVar21.d)->spans->offsets[uVar16 + lVar2] * 8));
      QHash<QGesture*,QGraphicsObject*>::removeImpl<QGesture*>
                ((QHash<QGesture*,QGraphicsObject*> *)this_00,
                 (QGesture **)
                 ((ulong)(QVar21.d)->spans->offsets[uVar16 + lVar2] * 8 +
                 *(long *)((QVar21.d)->spans->offsets + lVar2 + 0x80)));
      do {
        if ((QVar21.d)->numBuckets - 1 == uVar28) {
          uVar28 = 0;
          QVar21.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
          break;
        }
        uVar28 = uVar28 + 1;
      } while ((QVar21.d)->spans[uVar28 >> 7].offsets[(uint)uVar28 & 0x7f] == 0xff);
    } while ((uVar28 != 0) ||
            (QVar21.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0));
  }
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_a0);
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_98);
LAB_0061d313:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::cancelGesturesForChildren(QGesture *original)
{
    Q_ASSERT(original);
    QGraphicsItem *originalItem = gestureTargets.value(original);
    if (originalItem == nullptr) // we only act on accepted gestures, which implies it has a target.
        return;

    // iterate over all active gestures and for each find the owner
    // if the owner is part of our sub-hierarchy, cancel it.

    QSet<QGesture *> canceledGestures;
    QHash<QGesture *, QGraphicsObject *>::Iterator iter = gestureTargets.begin();
    while (iter != gestureTargets.end()) {
        QGraphicsObject *item = iter.value();
        // note that we don't touch the gestures for our originalItem
        if (item != originalItem && originalItem->isAncestorOf(item)) {
            DEBUG() << "  found a gesture to cancel" << iter.key();
            iter.key()->d_func()->state = Qt::GestureCanceled;
            canceledGestures << iter.key();
        }
        ++iter;
    }

    // sort them per target item by cherry picking from almostCanceledGestures and delivering
    QSet<QGesture *> almostCanceledGestures = canceledGestures;
    QSet<QGesture *>::Iterator setIter;
    while (!almostCanceledGestures.isEmpty()) {
        QGraphicsObject *target = nullptr;
        QSet<QGesture*> gestures;
        setIter = almostCanceledGestures.begin();
        // sort per target item
        while (setIter != almostCanceledGestures.end()) {
            QGraphicsObject *item = gestureTargets.value(*setIter);
            if (target == nullptr)
                target = item;
            if (target == item) {
                gestures << *setIter;
                setIter = almostCanceledGestures.erase(setIter);
            } else {
                ++setIter;
            }
        }
        Q_ASSERT(target);

        const QList<QGesture *> list = gestures.values();
        QGestureEvent ev(list);
        sendEvent(target, &ev);

        if (!ev.isAccepted()) {
            for (QGesture *g : list) {

                if (ev.isAccepted(g))
                    continue;

                if (!g->hasHotSpot())
                    continue;

                const QList<QGraphicsItem *> items = itemsAtPosition(QPoint(), g->d_func()->sceneHotSpot, nullptr);
                for (const auto &item : items) {
                    QGraphicsObject *object = item->toGraphicsObject();
                    if (!object)
                        continue;
                    QGraphicsItemPrivate *d = object->QGraphicsItem::d_func();
                    if (d->gestureContext.contains(g->gestureType())) {
                        QList<QGesture *> list;
                        list << g;
                        QGestureEvent ev(list);
                        sendEvent(object, &ev);
                        if (ev.isAccepted() || ev.isAccepted(g))
                            break; // successfully delivered
                    }
                }
            }
        }
    }

    QGestureManager *gestureManager = QApplicationPrivate::instance()->gestureManager;
    Q_ASSERT(gestureManager); // it would be very odd if we got called without a manager.
    for (setIter = canceledGestures.begin(); setIter != canceledGestures.end(); ++setIter) {
        gestureManager->recycle(*setIter);
        gestureTargets.remove(*setIter);
    }
}